

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
trieste::SourceDef::linecol(SourceDef *this,size_t pos)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  
  puVar1 = (this->lines).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = puVar1;
  uVar5 = (long)(this->lines).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
  while (puVar2 = puVar3, 0 < (long)uVar5) {
    uVar4 = uVar5 >> 1;
    uVar5 = ~uVar4 + uVar5;
    puVar3 = puVar2 + uVar4 + 1;
    if (pos <= puVar2[uVar4]) {
      puVar3 = puVar2;
      uVar5 = uVar4;
    }
  }
  if ((long)puVar2 - (long)puVar1 != 0) {
    pos = pos + ~puVar2[-1];
  }
  pVar6.first = (long)puVar2 - (long)puVar1 >> 3;
  pVar6.second = pos;
  return pVar6;
}

Assistant:

std::pair<size_t, size_t> linecol(size_t pos) const
    {
      // Lines and columns are 0-indexed.
      auto it = std::lower_bound(lines.begin(), lines.end(), pos);

      auto line = it - lines.begin();
      auto col = pos;

      if (it != lines.begin())
        col -= *(it - 1) + 1;

      return {line, col};
    }